

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::capacitor_allocation(Graph *this)

{
  double *pdVar1;
  Vertex *this_00;
  double dVar2;
  Capacitor local_98;
  Vertex *local_70;
  Vertex *alloc_vertex;
  double cost_change;
  double *last_loss_cost;
  Capacitor local_48;
  double local_20;
  double capacitor_cost;
  Graph *pGStack_10;
  int idLoad;
  Graph *this_local;
  
  capacitor_cost._4_4_ = 1;
  pGStack_10 = this;
  getCapacitorType(&local_48,this,1);
  dVar2 = Capacitor::getCost(&local_48);
  Capacitor::~Capacitor(&local_48);
  local_20 = dVar2;
  evaluateLossesAndFlows(this,1e-12,capacitor_cost._4_4_);
  cost_change = (double)operator_new__(0x10);
  pdVar1 = getTotalLoss(this);
  *(double *)cost_change = *pdVar1;
  pdVar1 = getTotalLoss(this);
  *(double *)((long)cost_change + 8) = pdVar1[1];
  alloc_vertex = (Vertex *)(local_20 * 2.0);
  while (local_20 < (double)alloc_vertex) {
    this_00 = greedyCapacitorAllocation(this);
    local_70 = this_00;
    getCapacitorType(&local_98,this,1);
    Vertex::addCapacitor(this_00,&local_98);
    Capacitor::~Capacitor(&local_98);
    evaluateLossesAndFlows(this,1e-12,capacitor_cost._4_4_);
    dVar2 = *(double *)((long)cost_change + 8);
    pdVar1 = getTotalLoss(this);
    alloc_vertex = (Vertex *)(dVar2 - pdVar1[1]);
    pdVar1 = getTotalLoss(this);
    *(double *)cost_change = *pdVar1;
    pdVar1 = getTotalLoss(this);
    *(double *)((long)cost_change + 8) = pdVar1[1];
  }
  Vertex::rmLastCapacitor(local_70);
  return;
}

Assistant:

void Graph::capacitor_allocation(){
    int idLoad = 1;
    double capacitor_cost = this->getCapacitorType(1).getCost();   // Custo do capacitor em kW
    this->evaluateLossesAndFlows(1e-12, idLoad);                   // Avalia no nível de carga mais pesado?

    double * last_loss_cost = new double[2];
    last_loss_cost[0] = this->getTotalLoss()[0];
    last_loss_cost[1] = this->getTotalLoss()[1];
    double cost_change = capacitor_cost*2;

//    uint iter = 0;
    Vertex * alloc_vertex ;
    while( capacitor_cost < cost_change ) {
        alloc_vertex = this->greedyCapacitorAllocation();
//        cout << "Vertice cap: " << alloc_vertex->getID() << endl;
        alloc_vertex->addCapacitor( this->getCapacitorType(1) );
        this->evaluateLossesAndFlows(1e-12, idLoad);
        cost_change = last_loss_cost[1] - this->getTotalLoss()[1];
//        cout << "  Total Loss:  " << graph->getTotalLoss()[0] << "KW"  << endl;
//        cout << "  Total Cost:  " << graph->getTotalLoss()[1] << "US$"  << endl;
//        cout << "  Loss Change: " << last_loss_cost[0] - this->getTotalLoss()[0] << "KW"  << endl;
//        cout << "  Cost Change: " << cost_change  << " US$"     << endl;
        last_loss_cost[0] = this->getTotalLoss()[0];
        last_loss_cost[1] = this->getTotalLoss()[1];
//        iter++;
    }

    alloc_vertex->rmLastCapacitor();
//    iter--;
//    cout << "Num caps: " << iter << endl;
}